

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

string * __thiscall
Assimp::BVHLoader::GetNextToken_abi_cxx11_(string *__return_storage_ptr__,BVHLoader *this)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  undefined1 local_21;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  BVHLoader *local_18;
  BVHLoader *this_local;
  string *token;
  
  local_18 = this;
  this_local = (BVHLoader *)__return_storage_ptr__;
  while( true ) {
    local_20._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->mBuffer);
    bVar1 = __gnu_cxx::operator!=(&this->mReader,&local_20);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->mReader);
    iVar2 = isspace((int)*pcVar3);
    if (iVar2 == 0) break;
    pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->mReader);
    if (*pcVar3 == '\n') {
      this->mLine = this->mLine + 1;
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&this->mReader);
  }
  local_21 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  do {
    local_30._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->mBuffer);
    bVar1 = __gnu_cxx::operator!=(&this->mReader,&local_30);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->mReader);
    iVar2 = isspace((int)*pcVar3);
    if (iVar2 != 0) {
      return __return_storage_ptr__;
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::operator*
              (&this->mReader);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&this->mReader);
    bVar1 = std::operator==(__return_storage_ptr__,"{");
    if (bVar1) {
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==(__return_storage_ptr__,"}");
  } while (!bVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string BVHLoader::GetNextToken()
{
    // skip any preceding whitespace
    while( mReader != mBuffer.end())
    {
        if( !isspace( *mReader))
            break;

        // count lines
        if( *mReader == '\n')
            mLine++;

        ++mReader;
    }

    // collect all chars till the next whitespace. BVH is easy in respect to that.
    std::string token;
    while( mReader != mBuffer.end())
    {
        if( isspace( *mReader))
            break;

        token.push_back( *mReader);
        ++mReader;

        // little extra logic to make sure braces are counted correctly
        if( token == "{" || token == "}")
            break;
    }

    // empty token means end of file, which is just fine
    return token;
}